

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::StepOutRequest>::copyConstruct
          (BasicTypeInfo<dap::StepOutRequest> *this,void *dst,void *src)

{
  *(long *)dst = (long)dst + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)dst,*src,*(long *)((long)src + 8) + *src);
  *(undefined1 *)((long)dst + 0x20) = *(undefined1 *)((long)src + 0x20);
  *(undefined1 *)((long)dst + 0x28) = *(undefined1 *)((long)src + 0x28);
  *(undefined1 *)((long)dst + 0x29) = *(undefined1 *)((long)src + 0x29);
  *(undefined8 *)((long)dst + 0x30) = *(undefined8 *)((long)src + 0x30);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }